

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall
re2::Compiler::UncachedRuneByteSuffix(Compiler *this,uint8 lo,uint8 hi,bool foldcase,int next)

{
  PatchList PVar1;
  Frag FVar2;
  uint32 local_20;
  PatchList PStack_1c;
  Frag f;
  int next_local;
  bool foldcase_local;
  uint8 hi_local;
  uint8 lo_local;
  Compiler *this_local;
  
  FVar2 = ByteRange(this,(uint)lo,(uint)hi,foldcase);
  PStack_1c = FVar2.end.p;
  if (next == 0) {
    PVar1 = PatchList::Append(this->inst_,(this->rune_range_).end.p,PStack_1c);
    (this->rune_range_).end.p = PVar1.p;
  }
  else {
    PatchList::Patch(this->inst_,PStack_1c,next);
  }
  local_20 = FVar2.begin;
  return local_20;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8 lo, uint8 hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_, f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_, rune_range_.end, f.end);
  }
  return f.begin;
}